

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepTiledInputFile::readPixelSampleCounts
          (DeepTiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  IStream *pIVar1;
  Compressor *pCVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  ArgExc *pAVar7;
  Int64 *pIVar8;
  InputExc *pIVar9;
  char *pcVar10;
  ulong uVar11;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  DeepTiledInputFile *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  stringstream _iex_replace_s;
  BaseExc *e;
  stringstream _iex_throw_s_6;
  int count;
  stringstream _iex_throw_s_5;
  int accumulatedCount;
  int i;
  int j;
  int lastAccumulatedCount;
  size_t cumulative_total_samples;
  stringstream _iex_throw_s_4;
  char *readPtr;
  stringstream _iex_throw_s_3;
  Int64 compressorMaxDataSize;
  stringstream _iex_throw_s_2;
  Int64 unpackedDataSize;
  Int64 dataSize;
  Int64 tableSize;
  int lyInFile;
  int lxInFile;
  int yInFile;
  int xInFile;
  int partNumber;
  int yOffset;
  int xOffset;
  Box2i tileRange;
  stringstream _iex_throw_s_1;
  int dx;
  int dy;
  int dY;
  int dyStop;
  int dyStart;
  stringstream _iex_throw_s;
  Lock lock;
  Int64 savedFilePos;
  int in_stack_ffffffffffffeffc;
  int in_stack_fffffffffffff000;
  int in_stack_fffffffffffff004;
  undefined4 in_stack_fffffffffffff008;
  int in_stack_fffffffffffff00c;
  undefined4 in_stack_fffffffffffff010;
  int dy_00;
  int in_stack_fffffffffffff014;
  TileOffsets *in_stack_fffffffffffff018;
  undefined8 in_stack_fffffffffffff068;
  undefined8 in_stack_fffffffffffff070;
  TileDescription *in_stack_fffffffffffff078;
  undefined8 in_stack_fffffffffffff090;
  undefined8 in_stack_fffffffffffff098;
  int in_stack_fffffffffffff0a0;
  int *in_stack_fffffffffffff0a8;
  stringstream local_b98 [16];
  ostream local_b88 [380];
  int local_a0c;
  stringstream local_a08 [16];
  ostream local_9f8 [376];
  int local_880;
  int local_87c;
  uint local_878;
  int local_874;
  long local_870;
  stringstream local_868 [16];
  ostream local_858 [376];
  char *local_6e0;
  stringstream local_6d8 [16];
  ostream local_6c8 [376];
  ulong local_550;
  stringstream local_548 [16];
  ostream local_538 [376];
  ulong local_3c0;
  ulong local_3b8;
  uint local_3b0;
  undefined4 uStack_3ac;
  int local_3a4;
  int local_3a0;
  int local_39c;
  int local_398;
  int local_394;
  int local_390;
  int local_38c;
  int local_388;
  uint local_384;
  int local_380;
  int local_37c;
  stringstream local_378 [16];
  ostream local_368 [380];
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  stringstream local_1d8 [16];
  ostream local_1c8 [408];
  undefined8 local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14 [3];
  
  local_30 = 0;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14[0] = in_ESI;
  IlmThread_2_5::Lock::Lock
            ((Lock *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),
             (Mutex *)CONCAT44(in_stack_fffffffffffff00c,in_stack_fffffffffffff008),
             SUB41((uint)in_stack_fffffffffffff004 >> 0x18,0));
  iVar4 = (*in_RDI->_data->_streamData->is->_vptr_IStream[5])();
  local_30 = CONCAT44(extraout_var,iVar4);
  bVar3 = isValidLevel((DeepTiledInputFile *)
                       CONCAT44(in_stack_fffffffffffff00c,in_stack_fffffffffffff008),
                       in_stack_fffffffffffff004,in_stack_fffffffffffff000);
  if (!bVar3) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1d8);
    poVar6 = std::operator<<(local_1c8,"Level coordinate (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_24);
    poVar6 = std::operator<<(poVar6,", ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,in_stack_00000008);
    std::operator<<(poVar6,") is invalid.");
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar7,local_1d8);
    __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if (local_18 < local_14[0]) {
    std::swap<int>(local_14,&local_18);
  }
  if (local_20 < local_1c) {
    std::swap<int>(&local_1c,&local_20);
  }
  local_1dc = local_1c;
  local_1e0 = local_20 + 1;
  local_1e4 = 1;
  if (in_RDI->_data->lineOrder == DECREASING_Y) {
    local_1dc = local_20;
    local_1e0 = local_1c + -1;
    local_1e4 = -1;
  }
  local_1e8 = local_1dc;
  do {
    if (local_1e8 == local_1e0) {
      pIVar1 = in_RDI->_data->_streamData->is;
      (*pIVar1->_vptr_IStream[6])(pIVar1,local_30);
      IlmThread_2_5::Lock::~Lock
                ((Lock *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000));
      return;
    }
    for (local_1ec = local_14[0]; local_1ec <= local_18; local_1ec = local_1ec + 1) {
      bVar3 = isValidTile(in_RDI,local_1ec,local_1e8,local_24,in_stack_00000008);
      if (!bVar3) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_378);
        poVar6 = std::operator<<(local_368,"Tile (");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1ec);
        poVar6 = std::operator<<(poVar6,", ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1e8);
        poVar6 = std::operator<<(poVar6,", ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_24);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,in_stack_00000008);
        std::operator<<(poVar6,") is not a valid tile.");
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar7,local_378);
        __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      iVar4 = local_1ec;
      in_stack_fffffffffffff000 = local_1e8;
      iVar5 = local_24;
      dy_00 = in_stack_00000008;
      Imf_2_5::dataWindowForTile
                (in_stack_fffffffffffff078,(int)((ulong)in_stack_fffffffffffff070 >> 0x20),
                 (int)in_stack_fffffffffffff070,(int)((ulong)in_stack_fffffffffffff068 >> 0x20),
                 (int)in_stack_fffffffffffff068,(int)in_stack_fffffffffffff090,
                 (int)in_stack_fffffffffffff098,in_stack_fffffffffffff0a0,
                 (int)in_stack_fffffffffffff0a8);
      local_38c = in_RDI->_data->sampleCountXTileCoords * local_388;
      local_390 = in_RDI->_data->sampleCountYTileCoords * local_384;
      pIVar1 = in_RDI->_data->_streamData->is;
      pIVar8 = TileOffsets::operator()
                         (in_stack_fffffffffffff018,in_stack_fffffffffffff014,dy_00,
                          in_stack_fffffffffffff00c,iVar5);
      (*pIVar1->_vptr_IStream[6])(pIVar1,*pIVar8);
      bVar3 = isMultiPart(in_RDI->_data->version);
      if ((bVar3) &&
         (Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                    ((IStream *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                     (int *)CONCAT44(in_stack_ffffffffffffeffc,iVar4)),
         local_394 != in_RDI->_data->partNumber)) {
        pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar9,"Unexpected part number.");
        __cxa_throw(pIVar9,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                ((IStream *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                 (int *)CONCAT44(in_stack_ffffffffffffeffc,iVar4));
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                ((IStream *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                 (int *)CONCAT44(in_stack_ffffffffffffeffc,iVar4));
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                ((IStream *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                 (int *)CONCAT44(in_stack_ffffffffffffeffc,iVar4));
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                ((IStream *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                 (int *)CONCAT44(in_stack_ffffffffffffeffc,iVar4));
      if (local_398 != local_1ec) {
        pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar9,"Unexpected tile x coordinate.");
        __cxa_throw(pIVar9,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      if (local_39c != local_1e8) {
        pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar9,"Unexpected tile y coordinate.");
        __cxa_throw(pIVar9,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      if (local_3a0 != local_24) {
        pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar9,"Unexpected tile x level number coordinate.");
        __cxa_throw(pIVar9,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      if (local_3a4 != in_stack_00000008) {
        pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar9,"Unexpected tile y level number coordinate.");
        __cxa_throw(pIVar9,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                ((IStream *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                 (unsigned_long *)CONCAT44(in_stack_ffffffffffffeffc,iVar4));
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                ((IStream *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                 (unsigned_long *)CONCAT44(in_stack_ffffffffffffeffc,iVar4));
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                ((IStream *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                 (unsigned_long *)CONCAT44(in_stack_ffffffffffffeffc,iVar4));
      if (in_RDI->_data->maxSampleCountTableSize < CONCAT44(uStack_3ac,local_3b0)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_548);
        poVar6 = std::operator<<(local_538,"Bad sampleCountTableDataSize read from tile ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1ec);
        poVar6 = std::operator<<(poVar6,',');
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1e8);
        poVar6 = std::operator<<(poVar6,',');
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_24);
        poVar6 = std::operator<<(poVar6,',');
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,in_stack_00000008);
        poVar6 = std::operator<<(poVar6,": expected ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,in_RDI->_data->maxSampleCountTableSize);
        poVar6 = std::operator<<(poVar6," or less, got ");
        std::ostream::operator<<(poVar6,CONCAT44(uStack_3ac,local_3b0));
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar7,local_548);
        __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      iVar5 = std::numeric_limits<int>::max();
      local_550 = (ulong)iVar5;
      if (((local_550 < local_3b8) || (local_550 < local_3c0)) ||
         (local_550 < CONCAT44(uStack_3ac,local_3b0))) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_6d8);
        poVar6 = std::operator<<(local_6c8,"This version of the library does not");
        poVar6 = std::operator<<(poVar6,"support the allocation of data with size  > ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_550);
        poVar6 = std::operator<<(poVar6," file table size    :");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,CONCAT44(uStack_3ac,local_3b0));
        poVar6 = std::operator<<(poVar6," file unpacked size :");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_3c0);
        poVar6 = std::operator<<(poVar6," file packed size   :");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_3b8);
        std::operator<<(poVar6,".\n");
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar7,local_6d8);
        __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pIVar1 = in_RDI->_data->_streamData->is;
      pcVar10 = Array::operator_cast_to_char_((Array *)&in_RDI->_data->sampleCountTableBuffer);
      (*pIVar1->_vptr_IStream[3])(pIVar1,pcVar10,(ulong)local_3b0);
      if (CONCAT44(uStack_3ac,local_3b0) < in_RDI->_data->maxSampleCountTableSize) {
        if (in_RDI->_data->sampleCountTableComp == (Compressor *)0x0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_868);
          poVar6 = std::operator<<(local_858,"Deep scanline data corrupt at tile ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1ec);
          poVar6 = std::operator<<(poVar6,',');
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1e8);
          poVar6 = std::operator<<(poVar6,',');
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_24);
          poVar6 = std::operator<<(poVar6,',');
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,in_stack_00000008);
          std::operator<<(poVar6," (sampleCountTableDataSize error)");
          pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar7,local_868);
          __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        pCVar2 = in_RDI->_data->sampleCountTableComp;
        pcVar10 = Array::operator_cast_to_char_((Array *)&in_RDI->_data->sampleCountTableBuffer);
        (*pCVar2->_vptr_Compressor[6])(pCVar2,pcVar10,(ulong)local_3b0,(ulong)local_384,&local_6e0);
      }
      else {
        local_6e0 = Array::operator_cast_to_char_((Array *)&in_RDI->_data->sampleCountTableBuffer);
      }
      local_870 = 0;
      for (local_878 = local_384; (int)local_878 <= local_37c; local_878 = local_878 + 1) {
        local_874 = 0;
        for (local_87c = local_388; local_87c <= local_380; local_87c = local_87c + 1) {
          Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                    ((char **)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                     (int *)CONCAT44(in_stack_ffffffffffffeffc,iVar4));
          if (local_880 < local_874) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream(local_a08);
            poVar6 = std::operator<<(local_9f8,"Deep tile sampleCount data corrupt at tile ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1ec);
            poVar6 = std::operator<<(poVar6,',');
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1e8);
            poVar6 = std::operator<<(poVar6,',');
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_24);
            poVar6 = std::operator<<(poVar6,',');
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,in_stack_00000008);
            std::operator<<(poVar6," (negative sample count detected)");
            pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar7,local_a08);
            __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          iVar5 = local_880 - local_874;
          local_874 = local_880;
          local_a0c = iVar5;
          in_stack_fffffffffffff0a8 =
               Data::getSampleCount
                         ((Data *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
                          in_stack_ffffffffffffeffc,iVar4);
          *in_stack_fffffffffffff0a8 = iVar5;
        }
        local_870 = local_874 + local_870;
      }
      uVar11 = local_870 * in_RDI->_data->combinedSampleSize;
      if (local_3c0 <= uVar11 && uVar11 - local_3c0 != 0) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_b98);
        poVar6 = std::operator<<(local_b88,"Deep scanline sampleCount data corrupt at tile ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1ec);
        poVar6 = std::operator<<(poVar6,',');
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1e8);
        poVar6 = std::operator<<(poVar6,',');
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_24);
        poVar6 = std::operator<<(poVar6,',');
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,in_stack_00000008);
        poVar6 = std::operator<<(poVar6,": pixel data only contains ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_3c0);
        poVar6 = std::operator<<(poVar6," bytes of data but table references at least ");
        poVar6 = (ostream *)
                 std::ostream::operator<<(poVar6,local_870 * in_RDI->_data->combinedSampleSize);
        std::operator<<(poVar6," bytes of sample data");
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar7,local_b98);
        __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
    local_1e8 = local_1e4 + local_1e8;
  } while( true );
}

Assistant:

void
DeepTiledInputFile::readPixelSampleCounts (int dx1, int dx2,
                                           int dy1, int dy2,
                                           int lx,  int ly)
{
    Int64 savedFilePos = 0;

    try
    {
        Lock lock (*_data->_streamData);

        savedFilePos = _data->_streamData->is->tellg();

        
        if (!isValidLevel (lx, ly))
        {
            THROW (IEX_NAMESPACE::ArgExc,
                   "Level coordinate "
                   "(" << lx << ", " << ly << ") "
                   "is invalid.");
        }
        
        if (dx1 > dx2)
            std::swap (dx1, dx2);

        if (dy1 > dy2)
            std::swap (dy1, dy2);

        int dyStart = dy1;
        int dyStop  = dy2 + 1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dyStop  = dy1 - 1;
            dY      = -1;
        }

        // (TODO) Check if we have read the sample counts for those tiles,
        // if we have, no need to read again.
        for (int dy = dyStart; dy != dyStop; dy += dY)
        {
            for (int dx = dx1; dx <= dx2; dx++)
            {
                
                if (!isValidTile (dx, dy, lx, ly))
                {
                    THROW (IEX_NAMESPACE::ArgExc,
                           "Tile (" << dx << ", " << dy << ", " <<
                           lx << "," << ly << ") is not a valid tile.");
                }
                
                Box2i tileRange = OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
                        _data->tileDesc,
                        _data->minX, _data->maxX,
                        _data->minY, _data->maxY,
                        dx, dy, lx, ly);

                int xOffset = _data->sampleCountXTileCoords * tileRange.min.x;
                int yOffset = _data->sampleCountYTileCoords * tileRange.min.y;

                //
                // Skip and check the tile coordinates.
                //

                _data->_streamData->is->seekg(_data->tileOffsets(dx, dy, lx, ly));

                if (isMultiPart(_data->version))
                {
                    int partNumber;
                    Xdr::read <StreamIO> (*_data->_streamData->is, partNumber);

                    if (partNumber != _data->partNumber)
                        throw IEX_NAMESPACE::InputExc ("Unexpected part number.");
                }

                int xInFile, yInFile, lxInFile, lyInFile;
                Xdr::read <StreamIO> (*_data->_streamData->is, xInFile);
                Xdr::read <StreamIO> (*_data->_streamData->is, yInFile);
                Xdr::read <StreamIO> (*_data->_streamData->is, lxInFile);
                Xdr::read <StreamIO> (*_data->_streamData->is, lyInFile);

                if (xInFile != dx)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile x coordinate.");

                if (yInFile != dy)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile y coordinate.");

                if (lxInFile != lx)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile x level number coordinate.");

                if (lyInFile != ly)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile y level number coordinate.");

                Int64 tableSize, dataSize, unpackedDataSize;
                Xdr::read <StreamIO> (*_data->_streamData->is, tableSize);
                Xdr::read <StreamIO> (*_data->_streamData->is, dataSize);
                Xdr::read <StreamIO> (*_data->_streamData->is, unpackedDataSize);

                
                if(tableSize>_data->maxSampleCountTableSize)
                {
                    THROW (IEX_NAMESPACE::ArgExc, "Bad sampleCountTableDataSize read from tile "<< dx << ',' << dy << ',' << lx << ',' << ly << ": expected " << _data->maxSampleCountTableSize << " or less, got "<< tableSize);
                }
                    
                
                //
                // We make a check on the data size requirements here.
                // Whilst we wish to store 64bit sizes on disk, not all the compressors
                // have been made to work with such data sizes and are still limited to
                // using signed 32 bit (int) for the data size. As such, this version
                // insists that we validate that the data size does not exceed the data
                // type max limit.
                // @TODO refactor the compressor code to ensure full 64-bit support.
                //

                Int64 compressorMaxDataSize = static_cast<Int64>(std::numeric_limits<int>::max());
                if (dataSize         > compressorMaxDataSize ||
                    unpackedDataSize > compressorMaxDataSize ||
                    tableSize        > compressorMaxDataSize)
                {
                    THROW (IEX_NAMESPACE::ArgExc, "This version of the library does not"
                          << "support the allocation of data with size  > "
                          << compressorMaxDataSize
                          << " file table size    :" << tableSize
                          << " file unpacked size :" << unpackedDataSize
                          << " file packed size   :" << dataSize << ".\n");
                }

                //
                // Read and uncompress the pixel sample count table.
                //

                _data->_streamData->is->read(_data->sampleCountTableBuffer, tableSize);

                const char* readPtr;

                if (tableSize < _data->maxSampleCountTableSize)
                {
                    if(!_data->sampleCountTableComp)
                    {
                        THROW(IEX_NAMESPACE::ArgExc,"Deep scanline data corrupt at tile " << dx << ',' << dy << ',' << lx << ',' <<  ly << " (sampleCountTableDataSize error)");
                    }
                    _data->sampleCountTableComp->uncompress(_data->sampleCountTableBuffer,
                                                            tableSize,
                                                            tileRange.min.y,
                                                            readPtr);
                }
                else
                    readPtr = _data->sampleCountTableBuffer;

                size_t cumulative_total_samples =0;
                int lastAccumulatedCount;
                for (int j = tileRange.min.y; j <= tileRange.max.y; j++)
                {
                    lastAccumulatedCount = 0;
                    for (int i = tileRange.min.x; i <= tileRange.max.x; i++)
                    {
                        int accumulatedCount;
                        Xdr::read <CharPtrIO> (readPtr, accumulatedCount);
                        
                        if (accumulatedCount < lastAccumulatedCount)
                        {
                            THROW(IEX_NAMESPACE::ArgExc,"Deep tile sampleCount data corrupt at tile " 
                                  << dx << ',' << dy << ',' << lx << ',' <<  ly << " (negative sample count detected)");
                        }

                        int count = accumulatedCount - lastAccumulatedCount;
                        lastAccumulatedCount = accumulatedCount;
                        
                        _data->getSampleCount(i - xOffset, j - yOffset) =count;
                    }
                    cumulative_total_samples += lastAccumulatedCount;
                }
                
                if(cumulative_total_samples * _data->combinedSampleSize > unpackedDataSize)
                {
                    THROW(IEX_NAMESPACE::ArgExc,"Deep scanline sampleCount data corrupt at tile " 
                                                << dx << ',' << dy << ',' << lx << ',' <<  ly 
                                                << ": pixel data only contains " << unpackedDataSize 
                                                << " bytes of data but table references at least " 
                                                << cumulative_total_samples*_data->combinedSampleSize << " bytes of sample data" );            
                }
                    
            }
        }

        _data->_streamData->is->seekg(savedFilePos);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading sample count data from image "
                     "file \"" << fileName() << "\". " << e.what());

         _data->_streamData->is->seekg(savedFilePos);

        throw;
    }
}